

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Scanner::skipComment(Scanner *this)

{
  iterator Position;
  
  if (*this->Current == '#') {
    Position = this->Current;
    while( true ) {
      Position = skip_nb_char(this,Position);
      if (Position == this->Current) break;
      this->Current = Position;
      this->Column = this->Column + 1;
    }
  }
  return;
}

Assistant:

void Scanner::skipComment() {
  if (*Current != '#')
    return;
  while (true) {
    // This may skip more than one byte, thus Column is only incremented
    // for code points.
    StringRef::iterator I = skip_nb_char(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }
}